

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator::GenerateBuildingCode
          (RepeatedImmutableStringFieldGenerator *this,Printer *printer)

{
  string_view text;
  
  text._M_str = 
  "if ($get_has_field_bit_from_local$) {\n  $name$_.makeImmutable();\n  result.$name$_ = $name$_;\n}\n"
  ;
  text._M_len = 0x5f;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_ImmutableStringFieldGenerator).variables_,text);
  return;
}

Assistant:

void RepeatedImmutableStringFieldGenerator::GenerateBuildingCode(
    io::Printer* printer) const {
  // The code below ensures that the result has an immutable list. If our
  // list is immutable, we can just reuse it. If not, we make it immutable.
  printer->Print(variables_,
                 "if ($get_has_field_bit_from_local$) {\n"
                 "  $name$_.makeImmutable();\n"
                 "  result.$name$_ = $name$_;\n"
                 "}\n");
}